

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  FileData *pFVar1;
  FileInfo *pFVar2;
  const_reference pcVar3;
  size_t sVar4;
  bool bVar5;
  size_t lineStart;
  FileData *fd;
  FileInfo *info;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffff70;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined8 in_stack_ffffffffffffff88;
  BufferID buffer;
  size_t local_58;
  SourceLocation local_10;
  size_t local_8;
  
  buffer.id = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  std::shared_lock<std::shared_mutex>::shared_lock
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SourceLocation::buffer((SourceLocation *)in_stack_ffffffffffffff78);
  pFVar2 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                     ((SourceManager *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                      ,buffer,in_stack_ffffffffffffff78);
  if ((pFVar2 == (FileInfo *)0x0) || (pFVar2->data == (FileData *)0x0)) {
    local_8 = 0;
  }
  else {
    pFVar1 = pFVar2->data;
    local_58 = SourceLocation::offset(&local_10);
    while( true ) {
      bVar5 = false;
      if (local_58 != 0) {
        pcVar3 = SmallVectorBase<char>::operator[]
                           (&(pFVar1->mem).super_SmallVectorBase<char>,local_58 - 1);
        bVar5 = false;
        if (*pcVar3 != '\n') {
          in_stack_ffffffffffffff70 =
               (shared_lock<std::shared_mutex> *)
               SmallVectorBase<char>::operator[]
                         (&(pFVar1->mem).super_SmallVectorBase<char>,local_58 - 1);
          bVar5 = *(char *)&in_stack_ffffffffffffff70->_M_pm != '\r';
        }
      }
      if (!bVar5) break;
      local_58 = local_58 - 1;
    }
    sVar4 = SourceLocation::offset(&local_10);
    local_8 = (sVar4 - local_58) + 1;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(in_stack_ffffffffffffff70);
  return local_8;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(location.buffer(), lock);
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    SLANG_ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}